

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fl-bool-type.cpp
# Opt level: O2

Up __thiscall yactfr::FixedLengthBooleanType::_clone(FixedLengthBooleanType *this)

{
  __uniq_ptr_impl<const_yactfr::FixedLengthBooleanType,_std::default_delete<const_yactfr::FixedLengthBooleanType>_>
  _Var1;
  long in_RSI;
  unique_ptr<const_yactfr::MapItem,_std::default_delete<const_yactfr::MapItem>_> local_50;
  __uniq_ptr_impl<const_yactfr::FixedLengthBooleanType,_std::default_delete<const_yactfr::FixedLengthBooleanType>_>
  local_48;
  unique_ptr<const_yactfr::MapItem,_std::default_delete<const_yactfr::MapItem>_> local_40;
  ByteOrder local_38;
  uint local_34;
  
  local_34 = *(uint *)(in_RSI + 0xc);
  local_38 = *(ByteOrder *)(in_RSI + 0x18);
  local_40._M_t.
  super___uniq_ptr_impl<const_yactfr::MapItem,_std::default_delete<const_yactfr::MapItem>_>._M_t.
  super__Tuple_impl<0UL,_const_yactfr::MapItem_*,_std::default_delete<const_yactfr::MapItem>_>.
  super__Head_base<0UL,_const_yactfr::MapItem_*,_false>._M_head_impl._4_4_ =
       *(undefined4 *)(in_RSI + 0x1c);
  local_40._M_t.
  super___uniq_ptr_impl<const_yactfr::MapItem,_std::default_delete<const_yactfr::MapItem>_>._M_t.
  super__Tuple_impl<0UL,_const_yactfr::MapItem_*,_std::default_delete<const_yactfr::MapItem>_>.
  super__Head_base<0UL,_const_yactfr::MapItem_*,_false>._M_head_impl._0_4_ =
       *(undefined4 *)(in_RSI + 0x20);
  internal::tryCloneAttrs((MapItem *)&local_50);
  std::
  make_unique<yactfr::FixedLengthBooleanType_const,unsigned_int,unsigned_int,yactfr::ByteOrder,yactfr::BitOrder,std::unique_ptr<yactfr::MapItem_const,std::default_delete<yactfr::MapItem_const>>>
            ((uint *)&local_48,&local_34,&local_38,
             (BitOrder *)
             ((long)&local_40._M_t.
                     super___uniq_ptr_impl<const_yactfr::MapItem,_std::default_delete<const_yactfr::MapItem>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_const_yactfr::MapItem_*,_std::default_delete<const_yactfr::MapItem>_>
                     .super__Head_base<0UL,_const_yactfr::MapItem_*,_false> + 4),&local_40);
  _Var1._M_t.
  super__Tuple_impl<0UL,_const_yactfr::FixedLengthBooleanType_*,_std::default_delete<const_yactfr::FixedLengthBooleanType>_>
  .super__Head_base<0UL,_const_yactfr::FixedLengthBooleanType_*,_false>._M_head_impl =
       local_48._M_t.
       super__Tuple_impl<0UL,_const_yactfr::FixedLengthBooleanType_*,_std::default_delete<const_yactfr::FixedLengthBooleanType>_>
       .super__Head_base<0UL,_const_yactfr::FixedLengthBooleanType_*,_false>._M_head_impl;
  local_48._M_t.
  super__Tuple_impl<0UL,_const_yactfr::FixedLengthBooleanType_*,_std::default_delete<const_yactfr::FixedLengthBooleanType>_>
  .super__Head_base<0UL,_const_yactfr::FixedLengthBooleanType_*,_false>._M_head_impl =
       (tuple<const_yactfr::FixedLengthBooleanType_*,_std::default_delete<const_yactfr::FixedLengthBooleanType>_>
        )(_Tuple_impl<0UL,_const_yactfr::FixedLengthBooleanType_*,_std::default_delete<const_yactfr::FixedLengthBooleanType>_>
          )0x0;
  (this->super_FixedLengthBitArrayType).super_ScalarDataType.super_DataType._vptr_DataType =
       (_func_int **)
       _Var1._M_t.
       super__Tuple_impl<0UL,_const_yactfr::FixedLengthBooleanType_*,_std::default_delete<const_yactfr::FixedLengthBooleanType>_>
       .super__Head_base<0UL,_const_yactfr::FixedLengthBooleanType_*,_false>._M_head_impl;
  std::
  unique_ptr<const_yactfr::FixedLengthBooleanType,_std::default_delete<const_yactfr::FixedLengthBooleanType>_>
  ::~unique_ptr((unique_ptr<const_yactfr::FixedLengthBooleanType,_std::default_delete<const_yactfr::FixedLengthBooleanType>_>
                 *)&local_48);
  std::unique_ptr<const_yactfr::MapItem,_std::default_delete<const_yactfr::MapItem>_>::~unique_ptr
            (&local_50);
  return (__uniq_ptr_data<const_yactfr::DataType,_std::default_delete<const_yactfr::DataType>,_true,_true>
          )(__uniq_ptr_data<const_yactfr::DataType,_std::default_delete<const_yactfr::DataType>,_true,_true>
            )this;
}

Assistant:

DataType::Up FixedLengthBooleanType::_clone() const
{
    return FixedLengthBooleanType::create(this->alignment(), this->length(), this->byteOrder(),
                                          this->bitOrder(),
                                          internal::tryCloneAttrs(this->attributes()));
}